

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_symbol_internWithString(sysbvm_context_t *context,size_t stringSize,char *string)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  sysbvm_tuple_t existent;
  sysbvm_stringSlice_t stringSlice;
  sysbvm_object_tuple_t *local_38;
  char *local_30;
  size_t local_28;
  
  local_30 = string;
  local_28 = stringSize;
  _Var1 = sysbvm_identitySet_findWithExplicitHash
                    (context,(context->roots).internedSymbolSet,&local_30,
                     sysbvm_stringSliceSymbol_hashFunction,sysbvm_stringSlice_equalsFunction,
                     (sysbvm_tuple_t *)&local_38);
  if (!_Var1) {
    local_38 = sysbvm_context_allocateByteTuple
                         (context,(context->roots).stringSymbolType,stringSize);
    if (local_38 == (sysbvm_object_tuple_t *)0x0) {
      local_38 = (sysbvm_object_tuple_t *)0x0;
    }
    else {
      if (stringSize == 0) {
        uVar3 = 0x1939b400;
      }
      else {
        iVar2 = 0x41c64e6d;
        sVar4 = 0;
        do {
          iVar2 = iVar2 * 0x41c64e6d + (uint)(byte)string[sVar4];
          sVar4 = sVar4 + 1;
        } while (stringSize != sVar4);
        uVar3 = iVar2 * 0x400;
      }
      (local_38->header).identityHashAndFlags =
           (local_38->header).identityHashAndFlags & 0x3ff | uVar3;
      memcpy(&local_38->field_1,string,stringSize);
      sysbvm_identitySet_insert(context,(context->roots).internedSymbolSet,(sysbvm_tuple_t)local_38)
      ;
    }
  }
  return (sysbvm_tuple_t)local_38;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_symbol_internWithString(sysbvm_context_t *context, size_t stringSize, const char *string)
{
    {
        sysbvm_stringSlice_t stringSlice = {
            .elements = string,
            .size = stringSize
        };

        sysbvm_tuple_t existent;
        if(sysbvm_identitySet_findWithExplicitHash(context, context->roots.internedSymbolSet, &stringSlice, sysbvm_stringSliceSymbol_hashFunction, sysbvm_stringSlice_equalsFunction, &existent))
            return existent;
    }

    sysbvm_object_tuple_t *result = sysbvm_context_allocateByteTuple(context, context->roots.stringSymbolType, stringSize);
    if(!result) return 0;

    // In the case of symbols, make the identity hash match with the string hash.
    sysbvm_tuple_setIdentityHash(result, sysbvm_string_computeHashWithBytes(stringSize, (const uint8_t*)string));

    memcpy(result->bytes, string, stringSize);
    sysbvm_identitySet_insert(context, context->roots.internedSymbolSet, (sysbvm_tuple_t)result);
    return (sysbvm_tuple_t)result;
}